

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matdurbn.c
# Opt level: O0

MATRIX mat_durbin(MATRIX R)

{
  int iVar1;
  int iVar2;
  MATRIX ppdVar3;
  MATRIX ppdVar4;
  MATRIX ppdVar5;
  MATRIX ppdVar6;
  undefined8 *in_RDI;
  MATRIX X;
  MATRIX A;
  MATRIX K;
  MATRIX E;
  MATRIX W;
  int p;
  int ji;
  int j;
  int i1;
  int i;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  int local_14;
  int local_c;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  iVar1 = *(int *)(in_RDI + -1) + -1;
  ppdVar3 = mat_creat((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8
                      ,iVar2);
  ppdVar4 = mat_creat((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8
                      ,iVar2);
  ppdVar5 = mat_creat((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8
                      ,iVar2);
  ppdVar6 = mat_creat((int)((ulong)ppdVar5 >> 0x20),(int)ppdVar5,iVar2);
  **ppdVar3 = *(double *)in_RDI[1];
  **ppdVar4 = *(double *)*in_RDI;
  for (local_c = 1; local_c <= iVar1; local_c = local_c + 1) {
    *ppdVar5[local_c] = *ppdVar3[local_c + -1] / *ppdVar4[local_c + -1];
    *ppdVar4[local_c] = *ppdVar4[local_c + -1] * (-*ppdVar5[local_c] * *ppdVar5[local_c] + 1.0);
    ppdVar6[local_c][local_c] = -*ppdVar5[local_c];
    iVar2 = local_c + -1;
    if (0 < iVar2) {
      for (local_14 = 1; local_14 <= iVar2; local_14 = local_14 + 1) {
        ppdVar6[local_14][local_c] =
             -*ppdVar5[local_c] * ppdVar6[local_c - local_14][iVar2] + ppdVar6[local_14][iVar2];
      }
    }
    if (local_c != iVar1) {
      *ppdVar3[local_c] = *(double *)in_RDI[local_c + 1];
      for (local_14 = 1; local_14 <= local_c; local_14 = local_14 + 1) {
        *ppdVar3[local_c] =
             ppdVar6[local_14][local_c] * *(double *)in_RDI[(local_c - local_14) + 1] +
             *ppdVar3[local_c];
      }
    }
  }
  ppdVar3 = mat_creat((int)((ulong)ppdVar5 >> 0x20),(int)ppdVar5,(int)((ulong)ppdVar6 >> 0x20));
  for (local_c = 0; local_c < iVar1; local_c = local_c + 1) {
    *ppdVar3[local_c] = -ppdVar6[local_c + 1][iVar1];
  }
  mat_free(ppdVar3);
  mat_free(ppdVar3);
  mat_free(ppdVar3);
  mat_free(ppdVar3);
  return ppdVar3;
}

Assistant:

MATRIX mat_durbin( MATRIX R )
{
	int	i, i1, j, ji, p;
	MATRIX	W, E, K, A, X;

	p = MatRow(R) - 1;
	W = mat_creat( p+2, 1, UNDEFINED );
	E = mat_creat( p+2, 1, UNDEFINED );
	K = mat_creat( p+2, 1, UNDEFINED );
	A = mat_creat( p+2, p+2, UNDEFINED );

	W[0][0] = R[1][0];
	E[0][0] = R[0][0];

	for (i=1; i<=p; i++)
		{
		K[i][0] = W[i-1][0] / E[i-1][0];
		E[i][0] = E[i-1][0] * (1.0 - K[i][0] * K[i][0]);

		A[i][i] = -K[i][0];

		i1 = i-1;
		if (i1 >= 1)
			{
			for (j=1; j<=i1; j++)
				{
				ji = i - j;
				A[j][i] = A[j][i1] - K[i][0] * A[ji][i1];
				}
			}

		if (i != p)
			{
			W[i][0] = R[i+1][0];
			for (j=1; j<=i; j++)
				W[i][0] += A[j][i] * R[i-j+1][0];
			}
		}

	X = mat_creat( p, 1, UNDEFINED );
	for (i=0; i<p; i++)
		{
		X[i][0] = -A[i+1][p];
		}

	mat_free( A );
	mat_free( W );
	mat_free( K );
	mat_free( E );
	return (X);
}